

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

void __thiscall cppgenerate::Class::Class(Class *this,string *name)

{
  string *name_local;
  Class *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_namespace);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_systemIncludes);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->m_localIncludes);
  std::vector<cppgenerate::Method,_std::allocator<cppgenerate::Method>_>::vector(&this->m_methods);
  std::vector<cppgenerate::MemberVariable,_std::allocator<cppgenerate::MemberVariable>_>::vector
            (&this->m_memberVariables);
  std::vector<cppgenerate::Constructor,_std::allocator<cppgenerate::Constructor>_>::vector
            (&this->m_constructors);
  std::vector<cppgenerate::Class::Parent,_std::allocator<cppgenerate::Class::Parent>_>::vector
            (&this->m_parents);
  std::__cxx11::string::string((string *)&this->m_documentation);
  this->m_isQobject = false;
  return;
}

Assistant:

Class::Class( std::string name ) :
    m_className( name ),
    m_isQobject( false )
{}